

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall pugi::xml_node::append_move(xml_node *this,xml_node *moved)

{
  ulong *puVar1;
  xml_node child;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  bool bVar4;
  xml_node_struct **ppxVar5;
  xml_node xVar6;
  xml_node_struct *pxVar7;
  
  xVar6 = (xml_node)this->_root;
  child = (xml_node)moved->_root;
  bVar4 = impl::anon_unknown_0::allow_move(xVar6,child);
  if (bVar4) {
    puVar1 = (ulong *)(*(long *)((long)xVar6._root - ((xVar6._root)->header >> 8)) + -0x40);
    *puVar1 = *puVar1 | 0x40;
    pxVar2 = (child._root)->parent;
    pxVar3 = (child._root)->next_sibling;
    pxVar7 = pxVar3;
    if (pxVar3 == (xml_node_struct *)0x0) {
      pxVar7 = pxVar2->first_child;
    }
    pxVar7->prev_sibling_c = (child._root)->prev_sibling_c;
    ppxVar5 = &pxVar2->first_child;
    if ((child._root)->prev_sibling_c->next_sibling != (xml_node_struct *)0x0) {
      ppxVar5 = &(child._root)->prev_sibling_c->next_sibling;
    }
    *ppxVar5 = pxVar3;
    (child._root)->parent = (xml_node_struct *)0x0;
    (child._root)->prev_sibling_c = (xml_node_struct *)0x0;
    (child._root)->next_sibling = (xml_node_struct *)0x0;
    pxVar2 = moved->_root;
    pxVar3 = this->_root;
    pxVar2->parent = pxVar3;
    pxVar7 = pxVar3->first_child;
    if (pxVar7 == (xml_node_struct *)0x0) {
      pxVar3->first_child = pxVar2;
      pxVar7 = pxVar2;
    }
    else {
      pxVar3 = pxVar7->prev_sibling_c;
      pxVar3->next_sibling = pxVar2;
      pxVar2->prev_sibling_c = pxVar3;
    }
    pxVar7->prev_sibling_c = pxVar2;
    xVar6 = (xml_node)moved->_root;
  }
  else {
    xVar6._root = (xml_node_struct *)0x0;
  }
  return (xml_node)xVar6._root;
}

Assistant:

PUGI__FN xml_node xml_node::append_move(const xml_node& moved)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::append_node(moved._root, _root);

		return moved;
	}